

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.hpp
# Opt level: O0

vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
* __thiscall
plot::detail::
vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>>
::next_impl<0ul,1ul>
          (vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
           *__return_storage_ptr__,
          vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>>
          *this)

{
  VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
  *vbox;
  block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>
  __x;
  block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>
  __x_00;
  bool first;
  size_t sVar1;
  __tuple_element_t<0UL,_tuple<block_iterator<Frame<RealCanvas<BrailleCanvas>_*>,_frame_line<RealCanvas<BrailleCanvas>_*>_>,_block_iterator<Frame<RealCanvas<BrailleCanvas>_*>,_frame_line<RealCanvas<BrailleCanvas>_*>_>_>_>
  *p_Var2;
  __tuple_element_t<1UL,_tuple<block_iterator<Frame<RealCanvas<BrailleCanvas>_*>,_frame_line<RealCanvas<BrailleCanvas>_*>_>,_block_iterator<Frame<RealCanvas<BrailleCanvas>_*>,_frame_line<RealCanvas<BrailleCanvas>_*>_>_>_>
  *p_Var3;
  __tuple_element_t<0UL,_tuple<block_iterator<Frame<RealCanvas<BrailleCanvas>_*>,_frame_line<RealCanvas<BrailleCanvas>_*>_>,_block_iterator<Frame<RealCanvas<BrailleCanvas>_*>,_frame_line<RealCanvas<BrailleCanvas>_*>_>_>_>
  *other;
  __tuple_element_t<1UL,_tuple<block_iterator<Frame<RealCanvas<BrailleCanvas>_*>,_frame_line<RealCanvas<BrailleCanvas>_*>_>,_block_iterator<Frame<RealCanvas<BrailleCanvas>_*>,_frame_line<RealCanvas<BrailleCanvas>_*>_>_>_>
  *other_00;
  size_t sVar4;
  size_t local_258;
  block_iterators local_218;
  block_iterators local_1b8;
  bool local_151;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  const_iterator cStack_128;
  block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>
  local_120;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  const_iterator cStack_c8;
  block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>
  local_c0;
  undefined1 local_90 [8];
  block_iterators nxt;
  size_t current;
  vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
  *this_local;
  
  sVar1 = current_index<0ul,1ul>();
  if (sVar1 == 0) {
    p_Var2 = std::
             get<0ul,plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>*>>,plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>*>>>
                       ((tuple<plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                         *)(this + 0x10));
    memcpy(&local_f0,p_Var2,0x30);
    __x.line_.overflow_ = uStack_e8;
    __x.line_.frame_ = (Frame<plot::RealCanvas<plot::BrailleCanvas>_*> *)local_f0;
    __x.line_.line_.line_.canvas_ = (BrailleCanvas *)local_e0;
    __x.line_.line_.line_.it_._M_current = (block_t *)uStack_d8;
    __x.line_.end_.line_.canvas_ = (BrailleCanvas *)local_d0;
    __x.line_.end_.line_.it_._M_current = cStack_c8._M_current;
    std::
    next<plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>*>>>
              (&local_c0,__x,1);
  }
  else {
    p_Var2 = std::
             get<0ul,plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>*>>,plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>*>>>
                       ((tuple<plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                         *)(this + 0x10));
    memcpy(&local_c0,p_Var2,0x30);
  }
  if (sVar1 == 1) {
    p_Var3 = std::
             get<1ul,plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>*>>,plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>*>>>
                       ((tuple<plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                         *)(this + 0x10));
    memcpy(&local_150,p_Var3,0x30);
    __x_00.line_.overflow_ = uStack_148;
    __x_00.line_.frame_ = (Frame<plot::RealCanvas<plot::BrailleCanvas>_*> *)local_150;
    __x_00.line_.line_.line_.canvas_ = (BrailleCanvas *)local_140;
    __x_00.line_.line_.line_.it_._M_current = (block_t *)uStack_138;
    __x_00.line_.end_.line_.canvas_ = (BrailleCanvas *)local_130;
    __x_00.line_.end_.line_.it_._M_current = cStack_128._M_current;
    std::
    next<plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>*>>>
              (&local_120,__x_00,1);
  }
  else {
    p_Var3 = std::
             get<1ul,plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>*>>,plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>*>>>
                       ((tuple<plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                         *)(this + 0x10));
    memcpy(&local_120,p_Var3,0x30);
  }
  std::
  tuple<plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  ::
  tuple<const_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_const_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_true>
            ((tuple<plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
              *)local_90,&local_c0,&local_120);
  vbox = *(VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
           **)this;
  p_Var2 = std::
           get<0ul,plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>*>>,plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>*>>>
                     ((tuple<plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                       *)local_90);
  other = std::
          get<0ul,plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>*>>,plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>*>>>
                    ((tuple<plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                      *)(this + 0x70));
  first = block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>
          ::operator!=(p_Var2,other);
  p_Var3 = std::
           get<1ul,plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>*>>,plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>*>>>
                     ((tuple<plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                       *)local_90);
  other_00 = std::
             get<1ul,plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>*>>,plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>*>>>
                       ((tuple<plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                         *)(this + 0x70));
  local_151 = block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>
              ::operator!=(p_Var3,other_00);
  sVar4 = find_true<bool>(first,&local_151);
  if (sVar4 == sVar1) {
    local_258 = 0;
  }
  else {
    local_258 = **(size_t **)this;
  }
  memcpy(&local_1b8,local_90,0x60);
  memcpy(&local_218,this + 0x70,0x60);
  vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
  ::vbox_line(__return_storage_ptr__,vbox,local_258,&local_1b8,&local_218);
  return __return_storage_ptr__;
}

Assistant:

vbox_line next_impl(std::index_sequence<N...> indices) const {
            auto current = current_index(indices);
            block_iterators nxt(((N != current) ? std::get<N>(lines_) : std::next(std::get<N>(lines_)))...);
            return {
                vbox_,
                (find_true((std::get<N>(nxt) != std::get<N>(ends_))...) != current) ? vbox_->margin_ : 0,
                nxt,
                ends_
            };
        }